

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<phmap::btree_set<int,std::greater<int>,std::allocator<int>>,void>
               (btree_set<int,_std::greater<int>,_std::allocator<int>_> *container,ostream *os)

{
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *pbVar1;
  int iVar2;
  long lVar3;
  const_iterator cVar4;
  char local_49;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_48;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *local_38;
  
  local_48.node =
       (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
        *)CONCAT71(local_48.node._1_7_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
  cVar4 = phmap::priv::
          btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          begin((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *)container);
  pbVar1 = cVar4.node;
  iVar2 = cVar4.position;
  local_48.node = pbVar1;
  local_48.position = iVar2;
  cVar4 = phmap::priv::
          btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          end((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
               *)container);
  local_38 = cVar4.node;
  if (iVar2 != cVar4.position || pbVar1 != local_38) {
    lVar3 = 0;
    do {
      if (((ulong)pbVar1 & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xf84,
                      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                     );
      }
      if (lVar3 != 0) {
        local_49 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_49,1);
        if (lVar3 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_00275681;
        }
      }
      local_49 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_49,1);
      std::ostream::operator<<((ostream *)os,*(int *)(pbVar1 + (long)iVar2 * 4 + 0xc));
      lVar3 = lVar3 + 1;
      phmap::priv::
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::increment(&local_48);
      pbVar1 = local_48.node;
      iVar2 = local_48.position;
    } while (local_48.position != cVar4.position || local_48.node != local_38);
    if (lVar3 != 0) {
LAB_00275681:
      local_48.node =
           (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            *)CONCAT71(local_48.node._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
    }
  }
  local_48.node =
       (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
        *)CONCAT71(local_48.node._1_7_,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }